

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Obj_t * Gia_ManFraigMarkCis(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xe6,"Gia_Obj_t *Gia_ManFraigMarkCis(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  uVar1 = *(uint *)pObj;
  pGVar3 = pObj;
  do {
    if ((uVar1 & 0x9fffffff) != 0x9fffffff) {
      return pObj;
    }
    if (fMark != 0) {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar4 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      p->pTravIds[iVar4] = p->nTravIds;
    }
    uVar1 = *(uint *)(pObj + -1);
    pObj = pObj + -1;
    pGVar3 = pGVar3 + -1;
  } while( true );
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCis( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( fMark )
            Gia_ObjSetTravIdCurrent( p, pObj );
    return pObj;
}